

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  string *psVar1;
  ostream *this;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var2;
  int local_2ac;
  duration<long,_std::ratio<1L,_1L>_> local_2a8;
  anon_class_1_0_00000001 local_299;
  Handler local_298;
  future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_> local_278;
  _Base_ptr local_268;
  undefined1 local_260;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  undefined1 local_218 [8];
  Options post_opts;
  Handler local_170;
  future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_> local_150;
  undefined1 local_140 [8];
  tuple<HttpWrapper::_Error,_HttpWrapper::_Response> ret;
  anon_class_1_0_00000001 local_e1;
  Handler local_e0;
  future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_> local_c0;
  undefined1 local_b0 [8];
  Options get_opts;
  
  get_opts.form._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  HttpWrapper::Options::Options((Options *)local_b0);
  local_b0 = (undefined1  [8])0x1228cc;
  std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>::
  function<main::__0,void>
            ((function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)> *)&local_e0,
             &local_e1);
  HttpWrapper::request<(HttpWrapper::Methods)0>
            ((HttpWrapper *)&local_c0,(Options *)local_b0,&local_e0);
  std::future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>::~future(&local_c0);
  std::function<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&)>::~function
            (&local_e0);
  std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>::
  function<HttpWrapper::request<(HttpWrapper::Methods)0>(HttpWrapper::Options_const&,std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>const&)::__0,void>
            ((function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)> *)&local_170,
             (anon_class_1_0_00000001 *)
             ((long)&post_opts.form._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  HttpWrapper::request<(HttpWrapper::Methods)0>
            ((HttpWrapper *)&local_150,(Options *)local_b0,&local_170);
  std::future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>::get
            ((tuple<HttpWrapper::_Error,_HttpWrapper::_Response> *)local_140,&local_150);
  std::future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>::~future(&local_150);
  std::function<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&)>::~function
            (&local_170);
  psVar1 = (string *)
           std::get<1ul,HttpWrapper::_Error,HttpWrapper::_Response>
                     ((tuple<HttpWrapper::_Error,_HttpWrapper::_Response> *)local_140);
  this = std::operator<<((ostream *)&std::cout,psVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  HttpWrapper::Options::Options(local_218);
  local_218 = (undefined1  [8])0x1228e4;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
            (&local_258,(char (*) [8])"message",(char (*) [6])"hello");
  _Var2 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&post_opts.field_0x68,&local_258);
  local_268 = (_Base_ptr)_Var2.first._M_node;
  local_260 = _Var2.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_258);
  std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>::
  function<main::__1,void>
            ((function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)> *)&local_298,
             &local_299);
  HttpWrapper::request<(HttpWrapper::Methods)1>
            ((HttpWrapper *)&local_278,(Options *)local_218,&local_298);
  std::future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>::~future(&local_278);
  std::function<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&)>::~function
            (&local_298);
  do {
    local_2ac = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_2a8,&local_2ac);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_2a8);
  } while( true );
}

Assistant:

int main() {
    //Get请求
    HttpWrapper::Options get_opts;
    get_opts.url = "http://0.0.0.0:1234/get";

    //异步操作
    HttpWrapper::request<HttpWrapper::GET>(get_opts,  [=](const HttpWrapper::Error& error, const HttpWrapper::Response& response) {

        if (!error) {
            cout << response.data << endl;
        }

    });

    //同步操作
    auto ret = HttpWrapper::request<HttpWrapper::GET>(get_opts).get();
    cout << std::get<1>(ret).data << endl;

    //Post 请求
    HttpWrapper::Options post_opts;
    post_opts.url = "http://0.0.0.0:1234/post";
    post_opts.form.insert(pair<string, string>("message", "hello"));

    HttpWrapper::request<HttpWrapper::POST>(post_opts, [=](const HttpWrapper::Error& error, const HttpWrapper::Response& response) {
        cout << response.data << endl;
    });

    while (1) {
        std::this_thread::sleep_for(chrono::seconds(1));
    }

    return 0;
}